

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

string * __thiscall
flatbuffers::java::JavaGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type)

{
  allocator<char> local_79;
  string local_78;
  Type local_58;
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  JavaGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (JavaGenerator *)__return_storage_ptr__;
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"String",&local_21);
    std::allocator<char>::~allocator(&local_21);
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType(&local_58,type);
    GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&local_58);
    break;
  case BASE_TYPE_STRUCT:
    IdlNamer::NamespacedType_abi_cxx11_(&local_78,&this->namer_,&type->struct_def->super_Definition)
    ;
    Prefixed(__return_storage_ptr__,this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    break;
  case BASE_TYPE_UNION:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Table",&local_79);
    std::allocator<char>::~allocator(&local_79);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypePointer(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenTypeGet(type.VectorType());
      case BASE_TYPE_STRUCT:
        return Prefixed(namer_.NamespacedType(*type.struct_def));
      case BASE_TYPE_UNION: FLATBUFFERS_FALLTHROUGH();  // else fall thru
      default: return "Table";
    }
  }